

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

X509_STORE * X509_STORE_new(void)

{
  stack_st_X509_OBJECT *psVar1;
  stack_st_X509_LOOKUP *psVar2;
  X509_VERIFY_PARAM *pXVar3;
  X509_STORE *ret;
  
  ret = (X509_STORE *)OPENSSL_zalloc(0x60);
  if ((X509_STORE *)ret == (X509_STORE *)0x0) {
    ret = (X509_STORE *)0x0;
  }
  else {
    *(undefined4 *)&((X509_STORE *)ret)->cert_crl = 1;
    CRYPTO_MUTEX_init((CRYPTO_MUTEX *)&((X509_STORE *)ret)->objs);
    psVar1 = sk_X509_OBJECT_new(x509_object_cmp_sk);
    *(stack_st_X509_OBJECT **)ret = psVar1;
    psVar2 = sk_X509_LOOKUP_new_null();
    ((X509_STORE *)ret)->check_revocation = (_func_1847 *)psVar2;
    pXVar3 = X509_VERIFY_PARAM_new();
    ((X509_STORE *)ret)->get_crl = (_func_1848 *)pXVar3;
    if (((*(long *)ret == 0) || (((X509_STORE *)ret)->check_revocation == (_func_1847 *)0x0)) ||
       (((X509_STORE *)ret)->get_crl == (_func_1848 *)0x0)) {
      X509_STORE_free((X509_STORE *)ret);
      ret = (X509_STORE *)0x0;
    }
  }
  return (X509_STORE *)ret;
}

Assistant:

X509_STORE *X509_STORE_new(void) {
  X509_STORE *ret =
      reinterpret_cast<X509_STORE *>(OPENSSL_zalloc(sizeof(X509_STORE)));
  if (ret == NULL) {
    return NULL;
  }

  ret->references = 1;
  CRYPTO_MUTEX_init(&ret->objs_lock);
  ret->objs = sk_X509_OBJECT_new(x509_object_cmp_sk);
  ret->get_cert_methods = sk_X509_LOOKUP_new_null();
  ret->param = X509_VERIFY_PARAM_new();
  if (ret->objs == NULL || ret->get_cert_methods == NULL ||
      ret->param == NULL) {
    X509_STORE_free(ret);
    return NULL;
  }

  return ret;
}